

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

bool __thiscall cmDebugger_impl::ClearBreakpoint(cmDebugger_impl *this,breakpoint_id id)

{
  size_type sVar1;
  size_type sVar2;
  vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *this_00;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  local_78;
  const_iterator local_70;
  size_type local_58;
  cmBreakpoint *local_50;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  local_48;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  local_40;
  const_iterator local_38;
  size_type local_30;
  size_type originalSize;
  anon_class_8_1_3fcf65d9_for__M_pred predicate;
  lock_guard<std::mutex> l;
  breakpoint_id id_local;
  cmDebugger_impl *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&predicate,&this->breakpointMutex);
  this_00 = &this->breakpoints;
  originalSize = id;
  local_30 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::size(this_00);
  local_48._M_current =
       (cmBreakpoint *)std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::begin(this_00);
  local_50 = (cmBreakpoint *)std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::end(this_00);
  local_58 = originalSize;
  local_40 = std::
             remove_if<__gnu_cxx::__normal_iterator<cmBreakpoint*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>,cmDebugger_impl::ClearBreakpoint(unsigned_long)::_lambda(cmBreakpoint_const&)_1_>
                       (local_48,(__normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
                                  )local_50,(anon_class_8_1_3fcf65d9_for__M_pred)originalSize);
  __gnu_cxx::
  __normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>::
  __normal_iterator<cmBreakpoint*>
            ((__normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>
              *)&local_38,&local_40);
  local_78._M_current =
       (cmBreakpoint *)
       std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::end(&this->breakpoints);
  __gnu_cxx::
  __normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>::
  __normal_iterator<cmBreakpoint*>
            ((__normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>
              *)&local_70,&local_78);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::erase(this_00,local_38,local_70);
  sVar1 = local_30;
  sVar2 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::size(&this->breakpoints);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&predicate);
  return sVar1 != sVar2;
}

Assistant:

bool ClearBreakpoint(breakpoint_id id) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto predicate = [id](const cmBreakpoint& breakpoint) {
      return breakpoint.Id == id;
    };
    auto originalSize = breakpoints.size();
    breakpoints.erase(
      std::remove_if(breakpoints.begin(), breakpoints.end(), predicate),
      breakpoints.end());
    return originalSize != breakpoints.size();
  }